

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioUtil.c
# Opt level: O3

Io_FileType_t Io_ReadFileType(char *pFileName)

{
  char cVar1;
  int iVar2;
  char *__s1;
  Io_FileType_t IVar3;
  
  IVar3 = IO_FILE_NONE;
  if (pFileName != (char *)0x0) {
    __s1 = Extra_FileNameExtension(pFileName);
    IVar3 = IO_FILE_NONE;
    if (__s1 != (char *)0x0) {
      iVar2 = strcmp(__s1,"aig");
      if (iVar2 == 0) {
        IVar3 = IO_FILE_AIGER;
      }
      else {
        iVar2 = strcmp(__s1,"baf");
        if (iVar2 == 0) {
          IVar3 = IO_FILE_BAF;
        }
        else {
          iVar2 = strcmp(__s1,"bblif");
          if (iVar2 == 0) {
            IVar3 = IO_FILE_BBLIF;
          }
          else {
            iVar2 = strcmp(__s1,"blif");
            if (iVar2 == 0) {
              IVar3 = IO_FILE_BLIF;
            }
            else {
              iVar2 = strcmp(__s1,"bench");
              if (iVar2 == 0) {
                IVar3 = IO_FILE_BENCH;
              }
              else {
                iVar2 = strcmp(__s1,"cnf");
                if (iVar2 == 0) {
                  IVar3 = IO_FILE_CNF;
                }
                else {
                  iVar2 = strcmp(__s1,"dot");
                  if (iVar2 == 0) {
                    IVar3 = IO_FILE_DOT;
                  }
                  else {
                    iVar2 = strcmp(__s1,"edif");
                    if (iVar2 == 0) {
                      IVar3 = IO_FILE_EDIF;
                    }
                    else {
                      iVar2 = strcmp(__s1,"eqn");
                      if (iVar2 == 0) {
                        IVar3 = IO_FILE_EQN;
                      }
                      else {
                        iVar2 = strcmp(__s1,"gml");
                        if (iVar2 == 0) {
                          IVar3 = IO_FILE_GML;
                        }
                        else {
                          iVar2 = strcmp(__s1,"list");
                          if (iVar2 == 0) {
                            IVar3 = IO_FILE_LIST;
                          }
                          else {
                            cVar1 = *__s1;
                            if (((cVar1 == 'm') && (__s1[1] == 'v')) && (__s1[2] == '\0')) {
                              IVar3 = IO_FILE_BLIFMV;
                            }
                            else {
                              iVar2 = strcmp(__s1,"pla");
                              if (iVar2 == 0) {
                                IVar3 = IO_FILE_PLA;
                              }
                              else {
                                iVar2 = strcmp(__s1,"smv");
                                if (iVar2 == 0) {
                                  IVar3 = IO_FILE_SMV;
                                }
                                else {
                                  IVar3 = IO_FILE_UNKNOWN;
                                  if (cVar1 == 'v') {
                                    IVar3 = IO_FILE_UNKNOWN - (__s1[1] == '\0');
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return IVar3;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Returns the file type.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Io_FileType_t Io_ReadFileType( char * pFileName )
{
    char * pExt;
    if ( pFileName == NULL )
        return IO_FILE_NONE;
    pExt = Extra_FileNameExtension( pFileName );
    if ( pExt == NULL )
        return IO_FILE_NONE;
    if ( !strcmp( pExt, "aig" ) )
        return IO_FILE_AIGER;
    if ( !strcmp( pExt, "baf" ) )
        return IO_FILE_BAF;
    if ( !strcmp( pExt, "bblif" ) )
        return IO_FILE_BBLIF;
    if ( !strcmp( pExt, "blif" ) )
        return IO_FILE_BLIF;
    if ( !strcmp( pExt, "bench" ) )
        return IO_FILE_BENCH;
    if ( !strcmp( pExt, "cnf" ) )
        return IO_FILE_CNF;
    if ( !strcmp( pExt, "dot" ) )
        return IO_FILE_DOT;
    if ( !strcmp( pExt, "edif" ) )
        return IO_FILE_EDIF;
    if ( !strcmp( pExt, "eqn" ) )
        return IO_FILE_EQN;
    if ( !strcmp( pExt, "gml" ) )
        return IO_FILE_GML;
    if ( !strcmp( pExt, "list" ) )
        return IO_FILE_LIST;
    if ( !strcmp( pExt, "mv" ) )
        return IO_FILE_BLIFMV;
    if ( !strcmp( pExt, "pla" ) )
        return IO_FILE_PLA;
    if ( !strcmp( pExt, "smv" ) )
        return IO_FILE_SMV;
    if ( !strcmp( pExt, "v" ) )
        return IO_FILE_VERILOG;
    return IO_FILE_UNKNOWN;
}